

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationX.hpp
# Opt level: O0

RotationX<std::complex<double>_> * __thiscall
qclab::qgates::RotationX<std::complex<double>_>::operator*=
          (RotationX<std::complex<double>_> *this,RotationX<std::complex<double>_> *rhs)

{
  int iVar1;
  int iVar2;
  rotation_type *rhs_00;
  RotationX<std::complex<double>_> *rhs_local;
  RotationX<std::complex<double>_> *this_local;
  
  iVar1 = (*(this->super_QRotationGate1<std::complex<double>_>).super_QGate1<std::complex<double>_>.
            super_QObject<std::complex<double>_>._vptr_QObject[3])();
  iVar2 = (*(rhs->super_QRotationGate1<std::complex<double>_>).super_QGate1<std::complex<double>_>.
            super_QObject<std::complex<double>_>._vptr_QObject[3])();
  if (iVar1 == iVar2) {
    rhs_00 = QRotationGate1<std::complex<double>_>::rotation
                       (&rhs->super_QRotationGate1<std::complex<double>_>);
    QRotation<double>::operator*=
              (&(this->super_QRotationGate1<std::complex<double>_>).rotation_,rhs_00);
    return this;
  }
  __assert_fail("this->qubit() == rhs.qubit()",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/include/qclab/qgates/RotationX.hpp"
                ,0xa3,
                "RotationX<T> &qclab::qgates::RotationX<std::complex<double>>::operator*=(const RotationX<T> &) [T = std::complex<double>]"
               );
}

Assistant:

inline RotationX< T >& operator*=( const RotationX< T >& rhs ) {
          assert( this->qubit() == rhs.qubit() ) ;
          this->rotation_ *= rhs.rotation() ;
          return *this ;
        }